

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

pthread_t * gpioStartThread(gpioThreadFunc_t *f,void *userdata)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  void *in_RSI;
  __start_routine *in_RDI;
  pthread_attr_t pthAttr;
  pthread_t *pth;
  pthread_attr_t local_58;
  pthread_t *local_20;
  void *local_18;
  __start_routine *local_10;
  
  pFVar1 = _stderr;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar3 = myTimeStamp();
    fprintf(pFVar1,"%s %s: f=%08X, userdata=%08X\n",pcVar3,"gpioStartThread",
            (ulong)local_10 & 0xffffffff,(ulong)local_18 & 0xffffffff);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar3 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar3,"gpioStartThread"
             );
    }
    return (pthread_t *)0x0;
  }
  local_20 = (pthread_t *)malloc(8);
  if (local_20 != (pthread_t *)0x0) {
    iVar2 = pthread_attr_init(&local_58);
    if (iVar2 != 0) {
      free(local_20);
      pFVar1 = _stderr;
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar3 = myTimeStamp();
        fprintf(pFVar1,"%s %s: pthread_attr_init failed\n",pcVar3,"gpioStartThread");
      }
      return (pthread_t *)0x0;
    }
    iVar2 = pthread_attr_setstacksize(&local_58,0x40000);
    if (iVar2 != 0) {
      free(local_20);
      pFVar1 = _stderr;
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar3 = myTimeStamp();
        fprintf(pFVar1,"%s %s: pthread_attr_setstacksize failed\n",pcVar3,"gpioStartThread");
      }
      return (pthread_t *)0x0;
    }
    iVar2 = pthread_create(local_20,&local_58,local_10,local_18);
    if (iVar2 != 0) {
      free(local_20);
      pFVar1 = _stderr;
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar3 = myTimeStamp();
        fprintf(pFVar1,"%s %s: pthread_create failed\n",pcVar3,"gpioStartThread");
      }
      return (pthread_t *)0x0;
    }
  }
  return local_20;
}

Assistant:

pthread_t *gpioStartThread(gpioThreadFunc_t f, void *userdata)
{
   pthread_t *pth;
   pthread_attr_t pthAttr;

   DBG(DBG_USER, "f=%08X, userdata=%08X", (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED_RET_NULL_PTR;

   pth = malloc(sizeof(pthread_t));

   if (pth)
   {
      if (pthread_attr_init(&pthAttr))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_attr_init failed");
      }

      if (pthread_attr_setstacksize(&pthAttr, STACK_SIZE))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_attr_setstacksize failed");
      }

      if (pthread_create(pth, &pthAttr, f, userdata))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_create failed");
      }
   }
   return pth;
}